

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

CTcPrsSymtab * __thiscall CTcCodeStream::set_local_frame(CTcCodeStream *this,CTcPrsSymtab *symtab)

{
  CTcPrsSymtab *this_00;
  
  this_00 = this->cur_frame_;
  if (this_00 != (CTcPrsSymtab *)0x0) {
    CTcPrsSymtab::add_to_range
              (this_00,(int)(this->super_CTcDataStream).ofs_ - (int)this->method_ofs_);
  }
  this->cur_frame_ = symtab;
  add_local_frame(this,symtab);
  CTcPrsSymtab::add_to_range(symtab,(int)(this->super_CTcDataStream).ofs_ - (int)this->method_ofs_);
  return this_00;
}

Assistant:

CTcPrsSymtab *CTcCodeStream::set_local_frame(CTcPrsSymtab *symtab)
{
    /* remember the original local frame, so we can return it later */
    CTcPrsSymtab *old_frame = cur_frame_;

    /* add the current byte code location to the outgoing frame */
    if (old_frame != 0)
        old_frame->add_to_range(ofs_ - method_ofs_);

    /* remember the current frame */
    cur_frame_ = symtab;

    /* add it to the local frame list for the method if necessary */
    add_local_frame(symtab);

    /* add the current byte code location to the incoming frame */
    symtab->add_to_range(ofs_ - method_ofs_);

    /* return the original local frame */
    return old_frame;
}